

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_to_string_with_a_few_controls_and_compressed_Test::TestBody
          (SubscriptionSyncTest_test_to_string_with_a_few_controls_and_compressed_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_e0;
  Message local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_90;
  SubscriptionSync local_78 [8];
  SubscriptionSync subscription_sync;
  SubscriptionSyncTest_test_to_string_with_a_few_controls_and_compressed_Test *this_local;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_90,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync(local_78,0x7b,&local_90);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_90);
  bidfx_public_api::price::pixie::SubscriptionSync::SetCompressed(SUB81(local_78,0));
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_78,TOGGLE);
  bidfx_public_api::price::pixie::SubscriptionSync::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[165],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\\n\" \"  Quantity=2500000,Symbol=EURGBP\\n\" \"  Quantity=5600000,Symbol=USDJPY (REFRESH)\\n\" \"]\""
             ,"subscription_sync.ToString()",
             (char (*) [165])
             "SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\n  Quantity=2500000,Symbol=EURGBP\n  Quantity=5600000,Symbol=USDJPY (REFRESH)\n]"
             ,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x7e,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  SubscriptionSync::~SubscriptionSync(local_78);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_to_string_with_a_few_controls_and_compressed)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);

    subscription_sync.SetCompressed(true);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);

    ASSERT_EQ("SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\n"
                 "  Quantity=2500000,Symbol=EURGBP\n"
                 "  Quantity=5600000,Symbol=USDJPY (REFRESH)\n"
                 "]", subscription_sync.ToString());
}